

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

void __thiscall QHexView::drawHeader(QHexView *this,QTextCursor *c)

{
  QHexDelegate *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  uint uVar6;
  ColorGroup CVar7;
  ulong uVar8;
  long *plVar9;
  QTextCharFormat *cf_00;
  QTextCharFormat *extraout_RDX;
  QTextCharFormat *extraout_RDX_00;
  QTextCharFormat *extraout_RDX_01;
  QTextCharFormat *extraout_RDX_02;
  QTextCharFormat *extraout_RDX_03;
  QTextCharFormat *extraout_RDX_04;
  QTextCharFormat *extraout_RDX_05;
  QTextCharFormat *extraout_RDX_06;
  QTextCharFormat *extraout_RDX_07;
  QTextCharFormat *extraout_RDX_08;
  QTextCharFormat *extraout_RDX_09;
  QTextCharFormat *extraout_RDX_10;
  QTextCharFormat *extraout_RDX_11;
  QTextCharFormat *extraout_RDX_12;
  QTextCharFormat *extraout_RDX_13;
  QTextCharFormat *extraout_RDX_14;
  QTextCharFormat *extraout_RDX_15;
  QTextCharFormat *pQVar10;
  QTextCharFormat *extraout_RDX_16;
  QTextCharFormat *extraout_RDX_17;
  QTextCharFormat *cf_01;
  ulong uVar11;
  int iVar12;
  qreal qVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QTextBlockFormat bf;
  QString asciilabel;
  QString hexlabel;
  QString t_2;
  QTextCharFormat cf;
  QString addresslabel;
  QString local_128;
  anon_union_24_3_e3d07ef4_for_data local_108;
  QString local_e8;
  QTextCursor *local_c8;
  anon_class_1_0_00000001 *local_c0;
  QString local_b8;
  QString local_a0;
  QArrayData *local_78;
  char16_t *pcStack_70;
  Data *local_68;
  double local_58;
  Data *local_50;
  QArrayData *local_48;
  
  if (((this->m_options).flags & 0x20) != 0) {
    return;
  }
  local_78 = (QArrayData *)0x0;
  pcStack_70 = (char16_t *)0x0;
  local_68 = (Data *)0x0;
  pQVar1 = this->m_hexdelegate;
  local_c8 = c;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_108,pQVar1,this);
    pDVar2 = local_68;
    pcVar3 = pcStack_70;
    pQVar5 = local_78;
    local_78 = (QArrayData *)local_108.shared;
    local_108.shared = (PrivateShared *)pQVar5;
    pcStack_70 = (char16_t *)local_108._8_8_;
    local_68 = (Data *)local_108._16_8_;
    local_108._8_8_ = pcVar3;
    local_108._16_8_ = pDVar2;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,8);
      }
    }
  }
  if ((local_68 == (Data *)0x0) && ((this->m_options).addresslabel.d.size != 0)) {
    QString::operator=((QString *)&stack0xffffffffffffff88,
                       (QString *)&(this->m_options).addresslabel);
  }
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&stack0xffffffffffffff78);
  local_c0 = (anon_class_1_0_00000001 *)&this->m_options;
  drawHeader::anon_class_1_0_00000001::operator()
            (local_c0,(QHexOptions *)&stack0xffffffffffffff78,cf_00);
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x88))
              (pQVar1,&stack0xffffffffffffff88,1,&stack0xffffffffffffff78,this);
  }
  uVar6 = (this->m_options).addresswidth;
  if (uVar6 == 0 && this->m_hexdocument != (QHexDocument *)0x0) {
    uVar6 = calcAddressWidth(this);
  }
  reduced(&local_128,(QString *)&stack0xffffffffffffff88,uVar6);
  QVar14.m_data = (storage_type *)0x1;
  QVar14.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar14);
  QString::append((QString *)&local_e8);
  local_b8.d.d = local_e8.d.d;
  local_b8.d.ptr = local_e8.d.ptr;
  local_b8.d.size = local_e8.d.size;
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar15.m_data = (storage_type *)0x1;
  QVar15.m_size = (qsizetype)&local_108;
  QString::fromUtf8(QVar15);
  QString::append((QString *)&local_b8);
  if ((QArrayData *)local_108.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_108.shared = *(int *)local_108.shared + -1;
    UNLOCK();
    if (*(int *)local_108.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_108.shared,2,8);
    }
  }
  QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_b8);
  pQVar10 = extraout_RDX;
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
      pQVar10 = extraout_RDX_00;
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
      pQVar10 = extraout_RDX_01;
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
      pQVar10 = extraout_RDX_02;
    }
  }
  if (this->m_hexdelegate != (QHexDelegate *)0x0) {
    drawHeader::anon_class_1_0_00000001::operator()
              (local_c0,(QHexOptions *)&stack0xffffffffffffff78,pQVar10);
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_108,pQVar1,this);
    qVar4 = local_b8.d.size;
    pcVar3 = local_b8.d.ptr;
    pDVar2 = local_b8.d.d;
    local_b8.d.d = (Data *)local_108.shared;
    local_108.shared = (PrivateShared *)pDVar2;
    local_b8.d.ptr = (char16_t *)local_108._8_8_;
    local_b8.d.size = local_108._16_8_;
    local_108._8_8_ = pcVar3;
    local_108._16_8_ = qVar4;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
  }
  if (local_b8.d.size == 0) {
    QString::operator=(&local_b8,(QString *)&(this->m_options).hexlabel);
  }
  if (local_b8.d.ptr == (char16_t *)0x0) {
    QVar18.m_data = (storage_type *)0x1;
    QVar18.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar18);
    local_e8.d.d = (Data *)local_108.shared;
    local_e8.d.ptr = (char16_t *)local_108._8_8_;
    local_e8.d.size = local_108._16_8_;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_108.data);
    QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_e8);
    QTextFormat::~QTextFormat((QTextFormat *)local_108.data);
    pQVar10 = extraout_RDX_07;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
        pQVar10 = extraout_RDX_08;
      }
    }
    if ((this->m_options).linelength != 0) {
      uVar6 = 0;
      do {
        QString::number((uint)&local_128,uVar6);
        QString::rightJustified
                  ((longlong)&local_108,(QChar)(char16_t)&local_128,
                   (bool)((char)(this->m_options).grouplength * '\x02'));
        QString::toUpper_helper((QString *)&local_e8);
        pQVar10 = extraout_RDX_09;
        if ((QArrayData *)local_108.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_108.shared = *(int *)local_108.shared + -1;
          UNLOCK();
          if (*(int *)local_108.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_108.shared,2,8);
            pQVar10 = extraout_RDX_10;
          }
        }
        if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
            pQVar10 = extraout_RDX_11;
          }
        }
        if (this->m_hexdelegate != (QHexDelegate *)0x0) {
          drawHeader::anon_class_1_0_00000001::operator()
                    (local_c0,(QHexOptions *)&stack0xffffffffffffff78,pQVar10);
          (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                    (this->m_hexdelegate,(QTextCharFormat *)&local_e8,2,
                     (QHexOptions *)&stack0xffffffffffffff78,this);
        }
        uVar11 = QHexCursor::column(this->m_hexcursor);
        if ((uVar11 == uVar6) && (((this->m_options).flags & 0x80) != 0)) {
          CVar7 = QWidget::palette();
          plVar9 = (long *)QPalette::brush(CVar7,Dark);
          QBrush::QBrush((QBrush *)&local_128,(QColor *)(*plVar9 + 8),SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&local_108,(QBrush *)&local_128);
          iVar12 = (int)(QHexOptions *)&stack0xffffffffffffff78;
          QTextFormat::setProperty(iVar12,(QVariant *)0x820);
          QVariant::~QVariant((QVariant *)&local_108);
          QBrush::~QBrush((QBrush *)&local_128);
          CVar7 = QWidget::palette();
          plVar9 = (long *)QPalette::brush(CVar7,Dark);
          QBrush::QBrush((QBrush *)&local_128,(QColor *)(*plVar9 + 8),SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&local_108,(QBrush *)&local_128);
          QTextFormat::setProperty(iVar12,(QVariant *)0x821);
          QVariant::~QVariant((QVariant *)&local_108);
          QBrush::~QBrush((QBrush *)&local_128);
        }
        QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_e8);
        QVar19.m_data = (storage_type *)0x1;
        QVar19.m_size = (qsizetype)&local_108;
        QString::fromUtf8(QVar19);
        local_128.d.d = (Data *)local_108.shared;
        local_128.d.ptr = (char16_t *)local_108._8_8_;
        local_128.d.size = local_108._16_8_;
        QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_108.data);
        QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_128);
        QTextFormat::~QTextFormat((QTextFormat *)local_108.data);
        pQVar10 = extraout_RDX_12;
        if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
            pQVar10 = extraout_RDX_13;
          }
        }
        drawHeader::anon_class_1_0_00000001::operator()
                  (local_c0,(QHexOptions *)&stack0xffffffffffffff78,pQVar10);
        pQVar10 = extraout_RDX_14;
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
            pQVar10 = extraout_RDX_15;
          }
        }
        uVar6 = uVar6 + (this->m_options).grouplength;
      } while (uVar6 < (this->m_options).linelength);
    }
  }
  else {
    pQVar1 = this->m_hexdelegate;
    if (pQVar1 != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_b8,2,&stack0xffffffffffffff78,this);
    }
    local_58 = hexColumnWidth(this);
    qVar13 = cellWidth(this);
    reduced(&local_a0,&local_b8,(int)(local_58 / qVar13 + -1.0));
    QVar16.m_data = (storage_type *)0x1;
    QVar16.m_size = (qsizetype)&local_128;
    QString::fromUtf8(QVar16);
    QString::append((QString *)&local_128);
    local_e8.d.d = local_128.d.d;
    local_e8.d.ptr = local_128.d.ptr;
    local_e8.d.size = local_128.d.size;
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar17.m_data = (storage_type *)0x1;
    QVar17.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar17);
    QString::append((QString *)&local_e8);
    if ((QArrayData *)local_108.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_108.shared = *(int *)local_108.shared + -1;
      UNLOCK();
      if (*(int *)local_108.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_108.shared,2,8);
      }
    }
    QTextCursor::insertText((QString *)local_c8);
    pQVar10 = extraout_RDX_03;
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
        pQVar10 = extraout_RDX_04;
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
        pQVar10 = extraout_RDX_05;
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,8);
        pQVar10 = extraout_RDX_06;
      }
    }
  }
  if (this->m_hexdelegate != (QHexDelegate *)0x0) {
    drawHeader::anon_class_1_0_00000001::operator()
              (local_c0,(QHexOptions *)&stack0xffffffffffffff78,pQVar10);
  }
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x70))(&local_108,pQVar1,this);
    qVar4 = local_e8.d.size;
    pcVar3 = local_e8.d.ptr;
    pDVar2 = local_e8.d.d;
    local_e8.d.d = (Data *)local_108.shared;
    local_108.shared = (PrivateShared *)pDVar2;
    local_e8.d.ptr = (char16_t *)local_108._8_8_;
    local_e8.d.size = local_108._16_8_;
    local_108._8_8_ = pcVar3;
    local_108._16_8_ = qVar4;
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,8);
      }
    }
  }
  if (local_e8.d.size == 0) {
    QString::operator=(&local_e8,(QString *)&(this->m_options).asciilabel);
  }
  if (local_e8.d.ptr == (char16_t *)0x0) {
    QVar22.m_data = (storage_type *)0x1;
    QVar22.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar22);
    local_128.d.d = (Data *)local_108.shared;
    local_128.d.ptr = (char16_t *)local_108._8_8_;
    local_128.d.size = local_108._16_8_;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_108.data);
    QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_128);
    QTextFormat::~QTextFormat((QTextFormat *)local_108.data);
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
      }
    }
    if ((this->m_options).linelength != 0) {
      uVar11 = 0;
      do {
        QString::number((uint)&local_108,(int)uVar11);
        QString::toUpper_helper((QString *)&local_128);
        pQVar10 = extraout_RDX_16;
        if ((QArrayData *)local_108.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_108.shared = *(int *)local_108.shared + -1;
          UNLOCK();
          if (*(int *)local_108.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_108.shared,2,8);
            pQVar10 = extraout_RDX_17;
          }
        }
        if (this->m_hexdelegate != (QHexDelegate *)0x0) {
          drawHeader::anon_class_1_0_00000001::operator()
                    (local_c0,(QHexOptions *)&stack0xffffffffffffff78,pQVar10);
          (**(code **)(*(long *)this->m_hexdelegate + 0x88))
                    (this->m_hexdelegate,&local_128,3,(QHexOptions *)&stack0xffffffffffffff78,this);
        }
        uVar8 = QHexCursor::column(this->m_hexcursor);
        if ((uVar11 == uVar8) && (((this->m_options).flags & 0x80) != 0)) {
          CVar7 = QWidget::palette();
          plVar9 = (long *)QPalette::brush(CVar7,Dark);
          QBrush::QBrush((QBrush *)&local_a0,(QColor *)(*plVar9 + 8),SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&local_108,(QBrush *)&local_a0);
          iVar12 = (int)(QHexOptions *)&stack0xffffffffffffff78;
          QTextFormat::setProperty(iVar12,(QVariant *)0x820);
          QVariant::~QVariant((QVariant *)&local_108);
          QBrush::~QBrush((QBrush *)&local_a0);
          CVar7 = QWidget::palette();
          plVar9 = (long *)QPalette::brush(CVar7,Dark);
          QBrush::QBrush((QBrush *)&local_a0,(QColor *)(*plVar9 + 8),SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&local_108,(QBrush *)&local_a0);
          QTextFormat::setProperty(iVar12,(QVariant *)0x821);
          QVariant::~QVariant((QVariant *)&local_108);
          QBrush::~QBrush((QBrush *)&local_a0);
        }
        QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_128);
        drawHeader::anon_class_1_0_00000001::operator()
                  (local_c0,(QHexOptions *)&stack0xffffffffffffff78,cf_01);
        if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (this->m_options).linelength);
    }
    QVar23.m_data = (storage_type *)0x1;
    QVar23.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar23);
    local_128.d.d = (Data *)local_108.shared;
    local_128.d.ptr = (char16_t *)local_108._8_8_;
    local_128.d.size = local_108._16_8_;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_108.data);
    QTextCursor::insertText((QString *)local_c8,(QTextCharFormat *)&local_128);
    QTextFormat::~QTextFormat((QTextFormat *)local_108.data);
    if (&(local_128.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_001c37b6;
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar12 = ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_48 = &(local_128.d.d)->super_QArrayData;
  }
  else {
    pQVar1 = this->m_hexdelegate;
    if (pQVar1 != (QHexDelegate *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_e8,3,&stack0xffffffffffffff78,this);
    }
    local_c0 = (anon_class_1_0_00000001 *)endColumnX(this);
    local_58 = asciiColumnX(this);
    local_50 = (Data *)cellWidth(this);
    qVar13 = cellWidth(this);
    reduced((QString *)&stack0xffffffffffffffb8,&local_e8,
            (int)((((double)local_c0 - local_58) - (double)local_50) / qVar13 + -1.0));
    QVar20.m_data = (storage_type *)0x1;
    QVar20.m_size = (qsizetype)&local_a0;
    QString::fromUtf8(QVar20);
    QString::append((QString *)&local_a0);
    local_128.d.d = local_a0.d.d;
    local_128.d.ptr = local_a0.d.ptr;
    local_128.d.size = local_a0.d.size;
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar21.m_data = (storage_type *)0x1;
    QVar21.m_size = (qsizetype)&local_108;
    QString::fromUtf8(QVar21);
    QString::append((QString *)&local_128);
    if ((QArrayData *)local_108.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_108.shared = *(int *)local_108.shared + -1;
      UNLOCK();
      if (*(int *)local_108.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_108.shared,2,8);
      }
    }
    QTextCursor::insertText((QString *)local_c8);
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_48 == (QArrayData *)0x0) goto LAB_001c37b6;
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar12 = (local_48->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar12 == 0) {
    QArrayData::deallocate(local_48,2,8);
  }
LAB_001c37b6:
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)&local_128);
  if (((this->m_options).flags & 8) != 0) {
    CVar7 = QWidget::palette();
    plVar9 = (long *)QPalette::brush(CVar7,Dark);
    QBrush::QBrush((QBrush *)&local_a0,(QColor *)(*plVar9 + 8),SolidPattern);
    QBrush::operator_cast_to_QVariant((QVariant *)&local_108,(QBrush *)&local_a0);
    QTextFormat::setProperty((uint)&local_128,(QVariant *)0x820);
    QVariant::~QVariant((QVariant *)&local_108);
    QBrush::~QBrush((QBrush *)&local_a0);
  }
  pQVar1 = this->m_hexdelegate;
  if (pQVar1 != (QHexDelegate *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&local_128,this);
  }
  QTextCursor::setBlockFormat((QTextBlockFormat *)local_c8);
  QTextCursor::insertBlock();
  QTextFormat::~QTextFormat((QTextFormat *)&local_128);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffff78);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  return;
}

Assistant:

void QHexView::drawHeader(QTextCursor& c) const {
    if(m_options.hasFlag(QHexFlags::NoHeader))
        return;

    static const auto RESET_FORMAT = [](const QHexOptions& options,
                                        QTextCharFormat& cf) {
        cf = {};
        cf.setForeground(options.headercolor);
    };

    QString addresslabel;
    if(m_hexdelegate)
        addresslabel = m_hexdelegate->addressHeader(this);
    if(addresslabel.isEmpty() && !m_options.addresslabel.isEmpty())
        addresslabel = m_options.addresslabel;

    QTextCharFormat cf;
    RESET_FORMAT(m_options, cf);
    if(m_hexdelegate)
        m_hexdelegate->renderHeaderPart(addresslabel, QHexArea::Address, cf,
                                        this);
    c.insertText(
        " " + QHexView::reduced(addresslabel, this->addressWidth()) + " ", cf);

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString hexlabel;
    if(m_hexdelegate)
        hexlabel = m_hexdelegate->hexHeader(this);
    if(hexlabel.isEmpty())
        hexlabel = m_options.hexlabel;

    if(hexlabel.isNull()) {
        c.insertText(" ", {});

        for(auto i = 0u; i < m_options.linelength; i += m_options.grouplength) {
            QString h = QString::number(i, 16)
                            .rightJustified(m_options.grouplength * 2, '0')
                            .toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(h, QHexArea::Hex, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(h, cf);
            c.insertText(" ", {});
            RESET_FORMAT(m_options, cf);
        }
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(hexlabel, QHexArea::Hex, cf, this);
        c.insertText(
            " " +
            QHexView::reduced(
                hexlabel, (this->hexColumnWidth() / this->cellWidth()) - 1) +
            " ");
    }

    if(m_hexdelegate)
        RESET_FORMAT(m_options, cf);

    QString asciilabel;
    if(m_hexdelegate)
        asciilabel = m_hexdelegate->asciiHeader(this);
    if(asciilabel.isEmpty())
        asciilabel = m_options.asciilabel;

    if(asciilabel.isNull()) {
        c.insertText(" ", {});

        for(unsigned int i = 0; i < m_options.linelength; i++) {
            QString a = QString::number(i, 16).toUpper();

            if(m_hexdelegate) {
                RESET_FORMAT(m_options, cf);
                m_hexdelegate->renderHeaderPart(a, QHexArea::Ascii, cf, this);
            }

            if(m_hexcursor->column() == static_cast<qint64>(i) &&
               m_options.hasFlag(QHexFlags::HighlightColumn)) {
                cf.setBackground(this->palette().color(QPalette::Highlight));
                cf.setForeground(
                    this->palette().color(QPalette::HighlightedText));
            }

            c.insertText(a, cf);
            RESET_FORMAT(m_options, cf);
        }

        c.insertText(" ", {});
    }
    else {
        if(m_hexdelegate)
            m_hexdelegate->renderHeaderPart(asciilabel, QHexArea::Ascii, cf,
                                            this);
        c.insertText(" " +
                     QHexView::reduced(asciilabel, ((this->endColumnX() -
                                                     this->asciiColumnX() -
                                                     this->cellWidth()) /
                                                    this->cellWidth()) -
                                                       1) +
                     " ");
    }

    QTextBlockFormat bf;
    if(m_options.hasFlag(QHexFlags::StyledHeader))
        bf.setBackground(this->palette().color(QPalette::Window));
    if(m_hexdelegate)
        m_hexdelegate->renderHeader(bf, this);
    c.setBlockFormat(bf);
    c.insertBlock();
}